

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

bool __thiscall
draco::EntryValue::GetValue<double>(EntryValue *this,vector<double,_std::allocator<double>_> *value)

{
  bool bVar1;
  size_type sVar2;
  reference __dest;
  const_reference __src;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t data_type_size;
  size_type in_stack_ffffffffffffffb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  vector<double,_std::allocator<double>_> *this_00;
  undefined1 local_1;
  
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    (in_stack_ffffffffffffffd0);
  if (bVar1) {
    local_1 = false;
  }
  else {
    this_00 = (vector<double,_std::allocator<double>_> *)0x8;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
    if ((sVar2 & 7) == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
      std::vector<double,_std::allocator<double>_>::resize(this_00,(size_type)in_RDI);
      __dest = std::vector<double,_std::allocator<double>_>::at(in_RSI,in_stack_ffffffffffffffb8);
      __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RDI,0);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
      memcpy(__dest,__src,sVar2);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool GetValue(std::vector<DataTypeT> *value) const {
    if (data_.empty()) {
      return false;
    }
    const size_t data_type_size = sizeof(DataTypeT);
    if (data_.size() % data_type_size != 0) {
      return false;
    }
    value->resize(data_.size() / data_type_size);
    memcpy(&value->at(0), &data_[0], data_.size());
    return true;
  }